

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewNodeSetList(xmlNodeSetPtr val)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr local_20;
  xmlXPathObjectPtr ret;
  xmlNodeSetPtr val_local;
  
  if (val == (xmlNodeSetPtr)0x0) {
    local_20 = (xmlXPathObjectPtr)0x0;
  }
  else if (val->nodeTab == (xmlNodePtr *)0x0) {
    local_20 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
  }
  else {
    local_20 = xmlXPathNewNodeSet(*val->nodeTab);
    if (local_20 != (xmlXPathObjectPtr)0x0) {
      pxVar1 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val);
      local_20->nodesetval = pxVar1;
      if (local_20->nodesetval == (xmlNodeSetPtr)0x0) {
        (*xmlFree)(local_20);
        return (xmlXPathObjectPtr)0x0;
      }
    }
  }
  return local_20;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewNodeSetList(xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;

    if (val == NULL)
        ret = NULL;
    else if (val->nodeTab == NULL)
        ret = xmlXPathNewNodeSet(NULL);
    else {
        ret = xmlXPathNewNodeSet(val->nodeTab[0]);
        if (ret) {
            ret->nodesetval = xmlXPathNodeSetMerge(NULL, val);
            if (ret->nodesetval == NULL) {
                xmlFree(ret);
                return(NULL);
            }
        }
    }

    return (ret);
}